

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JtagAnalyzer.cpp
# Opt level: O1

void __thiscall
JtagAnalyzer::CloseFrame
          (JtagAnalyzer *this,Frame *frm,JtagShiftedData *shifted_data,U64 ending_sample_number,
          JtagShiftedData *corrected_shifted_data)

{
  Frame FVar1;
  uchar uVar2;
  pointer puVar3;
  pointer puVar4;
  uchar *puVar5;
  pointer puVar6;
  
  FVar1 = frm[0x20];
  if ((FVar1 == (Frame)0xb) || (FVar1 == (Frame)0x4)) {
    if (((FVar1 == (Frame)0xb) && ((this->mSettings).mInstructRegBitOrder == LSB_First)) ||
       ((FVar1 == (Frame)0x4 && ((this->mSettings).mDataRegBitOrder == LSB_First)))) {
      puVar3 = (shifted_data->mTdiBits).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar4 = (shifted_data->mTdiBits).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish;
      puVar6 = puVar4 + -1;
      if (puVar3 < puVar6 && puVar3 != puVar4) {
        do {
          puVar5 = puVar3 + 1;
          uVar2 = *puVar3;
          *puVar3 = *puVar6;
          *puVar6 = uVar2;
          puVar6 = puVar6 + -1;
          puVar3 = puVar5;
        } while (puVar5 < puVar6);
      }
      puVar3 = (shifted_data->mTdoBits).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar4 = (shifted_data->mTdoBits).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish;
      puVar6 = puVar4 + -1;
      if (puVar3 < puVar6 && puVar3 != puVar4) {
        do {
          puVar5 = puVar3 + 1;
          uVar2 = *puVar3;
          *puVar3 = *puVar6;
          *puVar6 = uVar2;
          puVar6 = puVar6 + -1;
          puVar3 = puVar5;
        } while (puVar5 < puVar6);
      }
    }
    JtagAnalyzerResults::AddShiftedData((this->mResults)._M_ptr,shifted_data);
    if (corrected_shifted_data != (JtagShiftedData *)0x0) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (&corrected_shifted_data->mTdiBits,&shifted_data->mTdiBits);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (&corrected_shifted_data->mTdoBits,&shifted_data->mTdoBits);
    }
    puVar3 = (shifted_data->mTdiBits).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((shifted_data->mTdiBits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish != puVar3) {
      (shifted_data->mTdiBits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish = puVar3;
    }
    puVar3 = (shifted_data->mTdoBits).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((shifted_data->mTdoBits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish != puVar3) {
      (shifted_data->mTdoBits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish = puVar3;
    }
  }
  *(U64 *)(frm + 8) = ending_sample_number;
  AnalyzerResults::AddFrame((Frame *)(this->mResults)._M_ptr);
  return;
}

Assistant:

void JtagAnalyzer::CloseFrame( Frame& frm, JtagShiftedData& shifted_data, U64 ending_sample_number,
                               JtagShiftedData* corrected_shifted_data )
{
    // save the TDI/TDO values in the frame
    if( frm.mType == ShiftIR || frm.mType == ShiftDR )
    {
        // mind the bit order
        if( ( frm.mType == ShiftIR && mSettings.mInstructRegBitOrder == LSB_First ) ||
            ( frm.mType == ShiftDR && mSettings.mDataRegBitOrder == LSB_First ) )
        {
            std::reverse( shifted_data.mTdiBits.begin(), shifted_data.mTdiBits.end() );
            std::reverse( shifted_data.mTdoBits.begin(), shifted_data.mTdoBits.end() );
        }

        mResults->AddShiftedData( shifted_data );

        if( corrected_shifted_data != NULL )
        {
            corrected_shifted_data->mTdiBits = shifted_data.mTdiBits;
            corrected_shifted_data->mTdoBits = shifted_data.mTdoBits;
        }

        shifted_data.mTdiBits.clear();
        shifted_data.mTdoBits.clear();
    }

    frm.mEndingSampleInclusive = ending_sample_number;
    mResults->AddFrame( frm );
}